

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O2

Char * __thiscall Diligent::StringPool::CopyString(StringPool *this,char *Str)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  string msg;
  string local_30;
  
  if (Str == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = this->m_pCurrPtr;
    pcVar2 = pcVar3;
    while( true ) {
      cVar1 = *Str;
      if ((cVar1 == '\0') || (this->m_pBuffer + this->m_ReservedSize <= pcVar2)) break;
      Str = Str + 1;
      this->m_pCurrPtr = pcVar2 + 1;
      *pcVar2 = cVar1;
      pcVar2 = this->m_pCurrPtr;
    }
    if (pcVar2 < this->m_pBuffer + this->m_ReservedSize) {
      this->m_pCurrPtr = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    else {
      FormatString<char[45]>
                (&local_30,(char (*) [45])"Not enough space reserved in the string pool");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"CopyString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
                 ,0x95);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return pcVar3;
}

Assistant:

Char* CopyString(const char* Str)
    {
        if (Str == nullptr)
            return nullptr;

        auto* Ptr = m_pCurrPtr;
        while (*Str != 0 && m_pCurrPtr < m_pBuffer + m_ReservedSize)
        {
            *(m_pCurrPtr++) = *(Str++);
        }
        if (m_pCurrPtr < m_pBuffer + m_ReservedSize)
            *(m_pCurrPtr++) = 0;
        else
            UNEXPECTED("Not enough space reserved in the string pool");
        return Ptr;
    }